

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::TryReplaceLdLen(GlobOpt *this,Instr **instr)

{
  Opnd *pOVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RegOpnd *this_00;
  Value *pVVar8;
  ValueType *this_01;
  
  if (((*instr)->m_opcode != LdLen_A) || (pOVar1 = (*instr)->m_src1, pOVar1 == (Opnd *)0x0)) {
    return;
  }
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindSym) {
    return;
  }
  pOVar1 = (*instr)->m_src1;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar5) goto LAB_0044e2ae;
    *puVar7 = 0;
  }
  pp_Var2 = pOVar1[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var2 + 0x14) != '\x02') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x983,"(sym->IsPropertySym())","sym->IsPropertySym()");
    if (!bVar5) goto LAB_0044e2ae;
    *puVar7 = 0;
  }
  if (*(char *)((long)pp_Var2 + 0x14) != '\x02') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar5) {
LAB_0044e2ae:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this_00 = IR::RegOpnd::New((StackSym *)pp_Var2[4],TyVar,(*instr)->m_func);
  pVVar8 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)pp_Var2[4]);
  this_01 = &pVVar8->valueInfo->super_ValueType;
  bVar5 = ValueType::IsLikelyAnyArray(this_01);
  if ((((!bVar5) && (bVar5 = ValueType::HasHadStringTag(this_01), !bVar5)) &&
      (bVar5 = ValueType::IsLikelyString(this_01), !bVar5)) &&
     ((bVar5 = IR::Opnd::IsArgumentsObject(&this_00->super_Opnd), !bVar5 &&
      (((this->currentBlock->globOptData).argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0
       || (BVar6 = GlobOptBlockData::IsArgumentsOpnd
                             (&this->currentBlock->globOptData,&this_00->super_Opnd), BVar6 == 0))))
     )) {
    (*instr)->m_opcode = LdFld;
    return;
  }
  IR::Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,(bool)((pOVar1->field_0xb & 8) >> 3));
  IR::Opnd::SetValueType
            (&this_00->super_Opnd,
             (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_01->field_0).field_0);
  (this_00->super_Opnd).field_0xb = (this_00->super_Opnd).field_0xb & 0xfb | pOVar1->field_0xb & 4;
  IR::Instr::ReplaceSrc1(*instr,&this_00->super_Opnd);
  return;
}

Assistant:

void
GlobOpt::TryReplaceLdLen(IR::Instr *& instr)
{
    // Change LdLen on objects other than arrays, strings, and 'arguments' to LdFld. Otherwise, convert the SymOpnd to a RegOpnd here.
    if (instr->m_opcode == Js::OpCode::LdLen_A && instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd())
    {
        IR::SymOpnd * opnd = instr->GetSrc1()->AsSymOpnd();
        Sym *sym = opnd->m_sym;
        Assert(sym->IsPropertySym());
        PropertySym *originalPropertySym = sym->AsPropertySym();

        IR::RegOpnd* newopnd = IR::RegOpnd::New(originalPropertySym->m_stackSym, IRType::TyVar, instr->m_func);
        ValueInfo *const objectValueInfo = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym)->GetValueInfo();
        // things we'd emit a fast path for
        if (
            objectValueInfo->IsLikelyAnyArray() ||
            objectValueInfo->HasHadStringTag() ||
            objectValueInfo->IsLikelyString() ||
            newopnd->IsArgumentsObject() ||
            (CurrentBlockData()->argObjSyms && CurrentBlockData()->IsArgumentsOpnd(newopnd))
            )
        {
            // We need to properly transfer over the information from the old operand, which is
            // a SymOpnd, to the new one, which is a RegOpnd. Unfortunately, the types mean the
            // normal copy methods won't work here, so we're going to directly copy data.
            newopnd->SetIsJITOptimizedReg(opnd->GetIsJITOptimizedReg());
            newopnd->SetValueType(objectValueInfo->Type());
            newopnd->SetIsDead(opnd->GetIsDead());
            instr->ReplaceSrc1(newopnd);
        }
        else
        {
            // otherwise, change the instruction to an LdFld here.
            instr->m_opcode = Js::OpCode::LdFld;
        }
    }
}